

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O3

void __thiscall
ConfidentialTransaction_TxOutTest_Test::~ConfidentialTransaction_TxOutTest_Test
          (ConfidentialTransaction_TxOutTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ConfidentialTransaction, TxOutTest) {
  ConfidentialTransaction tx(exp_tx_empty_hex);
  uint32_t index = 0;
  uint32_t get_index = 0;
  EXPECT_NO_THROW((index = tx.AddTxIn(exp_txid, exp_index, exp_sequence)));

  // AddTxOut, GetTxOut, GetTxOutCount
  EXPECT_EQ(tx.GetTxOutCount(), 0);
  int64_t exp_satoshi = 12345678;
  EXPECT_THROW((get_index = tx.GetTxOutIndex(exp_locking_script)), CfdException);

  Amount amt = Amount::CreateBySatoshiAmount(exp_satoshi);
  ConfidentialAssetId asset(exp_assetid);
  ConfidentialTxOutReference txout_ref;
  EXPECT_NO_THROW((index = tx.AddTxOut(amt, asset, exp_locking_script)));
  EXPECT_EQ(index, 0);
  EXPECT_EQ(tx.GetTxOutCount(), 1);
  EXPECT_NO_THROW(get_index = tx.GetTxOutIndex(exp_locking_script));
  EXPECT_EQ(index, get_index);

  EXPECT_THROW((txout_ref = tx.GetTxOut(index + 5)), CfdException);
  EXPECT_NO_THROW((txout_ref = tx.GetTxOut(index)));
  EXPECT_STREQ(
      txout_ref.GetAsset().GetHex().c_str(),
      "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               "010000000000bc614e");
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(),
               exp_locking_script.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(), "");

  // AddTxOut
  Script exp_locking_script2("00146a98a3f2935718df72518c00768ec67c589e0b28");
  ConfidentialNonce nonce(
      "991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  ByteData surjection_proof("1234567890");
  ByteData range_proof("1234567890123456789012345678901234567890");
  EXPECT_NO_THROW(
      (index = tx.AddTxOut(amt, asset, exp_locking_script2, nonce,
                           surjection_proof, range_proof)));
  EXPECT_EQ(index, 1);
  EXPECT_EQ(tx.GetTxOutCount(), 2);
  EXPECT_NO_THROW((txout_ref = tx.GetTxOut(index)));
  EXPECT_STREQ(
      txout_ref.GetAsset().GetHex().c_str(),
      "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               "010000000000bc614e");
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(),
               exp_locking_script2.GetHex().c_str());
  EXPECT_STREQ(
      txout_ref.GetNonce().GetHex().c_str(),
      "01991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(),
               surjection_proof.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(),
               range_proof.GetHex().c_str());
  EXPECT_NO_THROW(get_index = tx.GetTxOutIndex(exp_locking_script2));
  EXPECT_EQ(index, get_index);

  // GetTxOutList
  std::vector<ConfidentialTxOutReference> txout_list;
  EXPECT_NO_THROW((txout_list = tx.GetTxOutList()));
  EXPECT_EQ(txout_list.size(), 2);
  txout_ref = txout_list[0];
  EXPECT_STREQ(
      txout_ref.GetAsset().GetHex().c_str(),
      "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               "010000000000bc614e");
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(),
               exp_locking_script.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(), "");

  txout_ref = txout_list[1];
  EXPECT_STREQ(
      txout_ref.GetAsset().GetHex().c_str(),
      "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               "010000000000bc614e");
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(),
               exp_locking_script2.GetHex().c_str());
  EXPECT_STREQ(
      txout_ref.GetNonce().GetHex().c_str(),
      "01991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(),
               surjection_proof.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(),
               range_proof.GetHex().c_str());

  // AddTxOut (address duplex)
  EXPECT_NO_THROW((index = tx.AddTxOut(amt, asset, exp_locking_script)));
  EXPECT_EQ(index, 2);
  EXPECT_EQ(tx.GetTxOutCount(), 3);
  EXPECT_NO_THROW(get_index = tx.GetTxOutIndex(exp_locking_script));
  EXPECT_EQ(0, get_index);
  std::vector<uint32_t> index_list;
  EXPECT_NO_THROW(index_list = tx.GetTxOutIndexList(exp_locking_script));
  EXPECT_EQ(2, index_list.size());
  if (index_list.size() == 2) {
    EXPECT_EQ(0, index_list[0]);
    EXPECT_EQ(2, index_list[1]);
  }

  // SetTxOutValue (address duplex)
  Amount amt2 = Amount::CreateBySatoshiAmount(7654321);
  EXPECT_NO_THROW(tx.SetTxOutValue(2, amt2));
  EXPECT_NO_THROW((txout_ref = tx.GetTxOut(2)));
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               "01000000000074cbb1");

  // RemoveTxOut
  EXPECT_THROW((tx.RemoveTxOut(3)), CfdException);
  EXPECT_NO_THROW((tx.RemoveTxOut(0)));
  EXPECT_EQ(tx.GetTxOutCount(), 2);
}